

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O1

void __thiscall
Clasp::ClaspBerkmin::newConstraint
          (ClaspBerkmin *this,Solver *s,Literal *first,size_type size,ConstraintType t)

{
  pointer pHVar1;
  Literal p;
  pointer pHVar2;
  bool inNant;
  uint uVar3;
  long lVar4;
  
  if (t == Static) {
    if ((this->order_).huang == true) goto LAB_001887b0;
  }
  else {
    if ((t != Conflict) ||
       (((this->order_).score.ebo_.buf)->act = 1, (this->order_).resScore != '\x01'))
    goto LAB_00188812;
LAB_001887b0:
    if (size != 0) {
      lVar4 = 0;
      do {
        p.rep_ = *(uint32 *)((long)&first->rep_ + lVar4);
        uVar3 = p.rep_ >> 2;
        if (uVar3 < (s->shared_->varInfo_).ebo_.size) {
          inNant = (bool)(((s->shared_->varInfo_).ebo_.buf[uVar3].rep & 0x20) >> 5);
        }
        else {
          inNant = false;
        }
        Order::inc(&this->order_,p,inNant);
        lVar4 = lVar4 + 4;
      } while ((ulong)size << 2 != lVar4);
    }
  }
  if (t == Static) {
    return;
  }
LAB_00188812:
  if (((this->order_).huang == false) && (size != 0)) {
    pHVar2 = (this->order_).score.ebo_.buf;
    lVar4 = 0;
    do {
      uVar3 = *(uint *)((long)&first->rep_ + lVar4);
      pHVar1 = pHVar2 + (uVar3 >> 2);
      pHVar1->occ = pHVar1->occ + (-(uint)((uVar3 >> 1 & 1) != 0) | 1);
      lVar4 = lVar4 + 4;
    } while ((ulong)size << 2 != lVar4);
  }
  return;
}

Assistant:

void ClaspBerkmin::newConstraint(const Solver& s, const Literal* first, LitVec::size_type size, ConstraintType t) {
	if (t == Constraint_t::Conflict) { hasActivities(true); }
	if ((t == Constraint_t::Conflict && order_.resScore == HeuParams::score_min)
	 || (t == Constraint_t::Static   && order_.huang)) {
		for (const Literal* x = first, *end = first+size; x != end; ++x) {
			order_.inc(*x, s.varInfo(x->var()).nant());
		}
	}
	if (t != Constraint_t::Static && !order_.huang) {
		for (const Literal* x = first, *end = first+size; x != end; ++x) { order_.incOcc(*x); }
	}
}